

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

float distance(Point *a,Point *b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  uVar1 = b->x;
  uVar2 = b->y;
  fVar5 = (float)uVar1 - a->x;
  fVar4 = (float)uVar2 - a->y;
  fVar3 = b->z - a->z;
  fVar3 = fVar3 * fVar3 + fVar5 * fVar5 + fVar4 * fVar4;
  if (0.0 <= fVar3) {
    return SQRT(fVar3);
  }
  fVar3 = sqrtf(fVar3);
  return fVar3;
}

Assistant:

float distance(Point const& a, Point const& b)
{
  return vectorLen(b - a);
}